

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

size_t __thiscall CoreML::Specification::CustomLayerParams::ByteSizeLong(CustomLayerParams *this)

{
  ulong uVar1;
  size_t sVar2;
  size_t sVar3;
  string *psVar4;
  Rep *pRVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  const_iterator it;
  iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>_>
  local_40;
  
  lVar8 = (long)(this->weights_).super_RepeatedPtrFieldBase.current_size_;
  lVar7 = lVar8 * 2;
  pRVar5 = (this->weights_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar5 != (Rep *)0x0) {
    pRVar5 = (Rep *)pRVar5->elements;
  }
  for (lVar6 = 0; lVar8 * 8 != lVar6; lVar6 = lVar6 + 8) {
    sVar2 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::WeightParams>
                      (*(WeightParams **)((long)pRVar5->elements + lVar6 + -8));
    lVar7 = lVar7 + sVar2;
  }
  sVar2 = lVar7 + ((this->parameters_).map_.elements_.num_elements_ & 0xffffffff) * 2;
  google::protobuf::
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>
  ::InnerMap::
  iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>_>
  ::iterator_base(&local_40,(InnerMap *)&this->parameters_);
  while (local_40.node_ != (Node *)0x0) {
    sVar3 = google::protobuf::internal::
            MapEntryFuncs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
            ::ByteSizeLong((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_40.node_,
                           (CustomLayerParams_CustomLayerParamValue *)&(local_40.node_)->field_0x20)
    ;
    sVar2 = sVar2 + sVar3;
    google::protobuf::
    Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>
    ::InnerMap::
    iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>_>
    ::operator++(&local_40);
  }
  psVar4 = (string *)((ulong)(this->classname_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
  if (psVar4->_M_string_length != 0) {
    sVar3 = google::protobuf::internal::WireFormatLite::StringSize(psVar4);
    sVar2 = sVar2 + sVar3 + 1;
  }
  psVar4 = (string *)((ulong)(this->description_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
  if (psVar4->_M_string_length != 0) {
    sVar3 = google::protobuf::internal::WireFormatLite::StringSize(psVar4);
    sVar2 = sVar2 + sVar3 + 2;
  }
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    sVar2 = sVar2 + *(long *)((uVar1 & 0xfffffffffffffffc) + 0x10);
  }
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type)sVar2;
  return sVar2;
}

Assistant:

size_t CustomLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.CustomLayerParams)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated .CoreML.Specification.WeightParams weights = 20;
  total_size += 2UL * this->_internal_weights_size();
  for (const auto& msg : this->weights_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // map<string, .CoreML.Specification.CustomLayerParams.CustomLayerParamValue> parameters = 30;
  total_size += 2 *
      ::PROTOBUF_NAMESPACE_ID::internal::FromIntSize(this->_internal_parameters_size());
  for (::PROTOBUF_NAMESPACE_ID::Map< std::string, ::CoreML::Specification::CustomLayerParams_CustomLayerParamValue >::const_iterator
      it = this->_internal_parameters().begin();
      it != this->_internal_parameters().end(); ++it) {
    total_size += CustomLayerParams_ParametersEntry_DoNotUse::Funcs::ByteSizeLong(it->first, it->second);
  }

  // string className = 10;
  if (!this->_internal_classname().empty()) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_classname());
  }

  // string description = 40;
  if (!this->_internal_description().empty()) {
    total_size += 2 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_description());
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}